

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_optional.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::TestProto3Optional::_InternalSerialize
          (TestProto3Optional *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  TestProto3Optional_NestedMessage *pTVar2;
  ulong uVar3;
  uint8_t *puVar4;
  char *in_R9;
  undefined8 *puVar5;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view field_name;
  string_view field_name_00;
  
  uVar1 = *(uint *)&this->field_0;
  if ((uVar1 & 0x40) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.optional_int32_,target);
  }
  if ((uVar1 & 0x20) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<2>
                       (stream,(this->field_0)._impl_.optional_int64_,target);
  }
  if ((char)uVar1 < '\0') {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (3,(this->field_0)._impl_.optional_uint32_,puVar4);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteUInt64ToArray
                       (4,(this->field_0)._impl_.optional_uint64_,puVar4);
  }
  if ((uVar1 >> 10 & 1) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteSInt32ToArray
                       (5,(this->field_0)._impl_.optional_sint32_,puVar4);
  }
  if ((uVar1 >> 9 & 1) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteSInt64ToArray
                       (6,(this->field_0)._impl_.optional_sint64_,puVar4);
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteFixed32ToArray
                       (7,(this->field_0)._impl_.optional_fixed32_,puVar4);
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteFixed64ToArray
                       (8,(this->field_0)._impl_.optional_fixed64_,puVar4);
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteSFixed32ToArray
                       (9,(this->field_0)._impl_.optional_sfixed32_,puVar4);
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteSFixed64ToArray
                       (10,(this->field_0)._impl_.optional_sfixed64_,puVar4);
  }
  if ((short)uVar1 < 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                       (0xb,(this->field_0)._impl_.optional_float_,puVar4);
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteDoubleToArray
                       (0xc,(this->field_0)._impl_.optional_double_,puVar4);
  }
  if ((uVar1 >> 0x11 & 1) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteBoolToArray
                       (0xd,(this->field_0)._impl_.optional_bool_,puVar4);
  }
  if ((uVar1 & 1) != 0) {
    puVar5 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.optional_string_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"proto2_unittest.TestProto3Optional.optional_string";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar5,(char *)(ulong)*(uint *)(puVar5 + 1),1,0x32,field_name);
    s._M_str = (char *)*puVar5;
    s._M_len = puVar5[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,0xe,s,target)
    ;
  }
  if ((uVar1 & 2) != 0) {
    puVar5 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.optional_bytes_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    s_00._M_str = (char *)*puVar5;
    s_00._M_len = puVar5[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xf,s_00,target);
  }
  if ((uVar1 & 4) != 0) {
    puVar5 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.optional_cord_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_00._M_str = in_R9;
    field_name_00._M_len = (size_t)"proto2_unittest.TestProto3Optional.optional_cord";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar5,(char *)(ulong)*(uint *)(puVar5 + 1),1,0x30,field_name_00);
    s_01._M_str = (char *)*puVar5;
    s_01._M_len = puVar5[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x10,s_01,target);
  }
  if ((uVar1 & 8) != 0) {
    pTVar2 = (this->field_0)._impl_.optional_nested_message_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0x12,(MessageLite *)pTVar2,*(int *)((long)&pTVar2->field_0 + 4),target,
                        stream);
  }
  if ((uVar1 & 0x10) != 0) {
    pTVar2 = (this->field_0)._impl_.lazy_nested_message_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (0x13,(MessageLite *)pTVar2,*(int *)((long)&pTVar2->field_0 + 4),target,
                        stream);
  }
  if ((uVar1 >> 0x12 & 1) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (0x15,(this->field_0)._impl_.optional_nested_enum_,puVar4);
  }
  if (((uVar1 >> 0x14 & 1) != 0) && ((this->field_0)._impl_.singular_int32_ != 0)) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                       (0x16,(this->field_0)._impl_.singular_int32_,puVar4);
  }
  if (((uVar1 >> 0x13 & 1) != 0) && ((this->field_0)._impl_.singular_int64_ != 0)) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteInt64ToArray
                       (0x17,(this->field_0)._impl_.singular_int64_,puVar4);
  }
  uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar3 & 1) == 0) {
    return target;
  }
  puVar4 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar4;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestProto3Optional::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestProto3Optional& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestProto3Optional)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional int32 optional_int32 = 1;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_optional_int32(), target);
  }

  // optional int64 optional_int64 = 2;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<2>(
            stream, this_._internal_optional_int64(), target);
  }

  // optional uint32 optional_uint32 = 3;
  if ((cached_has_bits & 0x00000080u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        3, this_._internal_optional_uint32(), target);
  }

  // optional uint64 optional_uint64 = 4;
  if ((cached_has_bits & 0x00000100u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt64ToArray(
        4, this_._internal_optional_uint64(), target);
  }

  // optional sint32 optional_sint32 = 5;
  if ((cached_has_bits & 0x00000400u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSInt32ToArray(
        5, this_._internal_optional_sint32(), target);
  }

  // optional sint64 optional_sint64 = 6;
  if ((cached_has_bits & 0x00000200u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSInt64ToArray(
        6, this_._internal_optional_sint64(), target);
  }

  // optional fixed32 optional_fixed32 = 7;
  if ((cached_has_bits & 0x00000800u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed32ToArray(
        7, this_._internal_optional_fixed32(), target);
  }

  // optional fixed64 optional_fixed64 = 8;
  if ((cached_has_bits & 0x00001000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed64ToArray(
        8, this_._internal_optional_fixed64(), target);
  }

  // optional sfixed32 optional_sfixed32 = 9;
  if ((cached_has_bits & 0x00004000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSFixed32ToArray(
        9, this_._internal_optional_sfixed32(), target);
  }

  // optional sfixed64 optional_sfixed64 = 10;
  if ((cached_has_bits & 0x00002000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSFixed64ToArray(
        10, this_._internal_optional_sfixed64(), target);
  }

  // optional float optional_float = 11;
  if ((cached_has_bits & 0x00008000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFloatToArray(
        11, this_._internal_optional_float(), target);
  }

  // optional double optional_double = 12;
  if ((cached_has_bits & 0x00010000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteDoubleToArray(
        12, this_._internal_optional_double(), target);
  }

  // optional bool optional_bool = 13;
  if ((cached_has_bits & 0x00020000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        13, this_._internal_optional_bool(), target);
  }

  // optional string optional_string = 14;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_optional_string();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "proto2_unittest.TestProto3Optional.optional_string");
    target = stream->WriteStringMaybeAliased(14, _s, target);
  }

  // optional bytes optional_bytes = 15;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_optional_bytes();
    target = stream->WriteBytesMaybeAliased(15, _s, target);
  }

  // optional string optional_cord = 16 [ctype = CORD];
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_optional_cord();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "proto2_unittest.TestProto3Optional.optional_cord");
    target = stream->WriteStringMaybeAliased(16, _s, target);
  }

  // optional .proto2_unittest.TestProto3Optional.NestedMessage optional_nested_message = 18;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        18, *this_._impl_.optional_nested_message_, this_._impl_.optional_nested_message_->GetCachedSize(), target,
        stream);
  }

  // optional .proto2_unittest.TestProto3Optional.NestedMessage lazy_nested_message = 19 [lazy = true];
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        19, *this_._impl_.lazy_nested_message_, this_._impl_.lazy_nested_message_->GetCachedSize(), target,
        stream);
  }

  // optional .proto2_unittest.TestProto3Optional.NestedEnum optional_nested_enum = 21;
  if ((cached_has_bits & 0x00040000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        21, this_._internal_optional_nested_enum(), target);
  }

  // int32 singular_int32 = 22;
  if ((cached_has_bits & 0x00100000u) != 0) {
    if (this_._internal_singular_int32() != 0) {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteInt32ToArray(
          22, this_._internal_singular_int32(), target);
    }
  }

  // int64 singular_int64 = 23;
  if ((cached_has_bits & 0x00080000u) != 0) {
    if (this_._internal_singular_int64() != 0) {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteInt64ToArray(
          23, this_._internal_singular_int64(), target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestProto3Optional)
  return target;
}